

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * scanblocks(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe118;
  allocator<RPCArg> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffe120;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe130;
  BlockFilterType in_stack_ffffffffffffe13f;
  RPCResults *in_stack_ffffffffffffe140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe148;
  RPCArg *in_stack_ffffffffffffe150;
  RPCArg *in_stack_ffffffffffffe158;
  iterator in_stack_ffffffffffffe160;
  RPCArgOptions *in_stack_ffffffffffffe168;
  string *in_stack_ffffffffffffe170;
  undefined7 in_stack_ffffffffffffe178;
  undefined1 in_stack_ffffffffffffe17f;
  undefined4 in_stack_ffffffffffffe180;
  Type in_stack_ffffffffffffe184;
  string *in_stack_ffffffffffffe188;
  undefined4 in_stack_ffffffffffffe190;
  Type in_stack_ffffffffffffe194;
  undefined4 in_stack_ffffffffffffe198;
  Type in_stack_ffffffffffffe19c;
  RPCArg *in_stack_ffffffffffffe1a0;
  RPCArgOptions *in_stack_ffffffffffffe1c0;
  undefined1 *local_1dd0;
  undefined1 *local_1db8;
  RPCExamples *in_stack_ffffffffffffe260;
  RPCResults *in_stack_ffffffffffffe268;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffe270;
  string *in_stack_ffffffffffffe278;
  string *in_stack_ffffffffffffe280;
  RPCHelpMan *in_stack_ffffffffffffe288;
  undefined1 *local_1d70;
  allocator<RPCArg> *local_1d58;
  _Any_data *fun;
  undefined1 local_1a48 [36];
  allocator<char> local_1a24;
  allocator<char> local_1a23;
  allocator<char> local_1a22;
  allocator<char> local_1a21;
  allocator<char> local_1a20;
  allocator<char> local_1a1f;
  allocator<char> local_1a1e;
  allocator<char> local_1a1d;
  allocator<char> local_1a1c;
  allocator<char> local_1a1b;
  allocator<char> local_1a1a [2];
  pointer local_1a18;
  pointer pRStack_1a10;
  undefined1 local_1a08 [15];
  allocator<char> local_19f9 [31];
  allocator<char> local_19da;
  allocator<char> local_19d9 [29];
  allocator<char> local_19bc;
  allocator<char> local_19bb;
  allocator<char> local_19ba [2];
  _Any_data local_19b8;
  _Alloc_hider local_19a8;
  allocator<char> local_199b;
  allocator<char> local_199a [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1998;
  undefined1 local_1988 [15];
  allocator<char> local_1979 [31];
  allocator<char> local_195a;
  allocator<char> local_1959;
  pointer local_1958;
  pointer pbStack_1950;
  undefined8 local_1948;
  allocator<char> local_193a;
  allocator<char> local_1939;
  undefined8 local_1938;
  undefined8 uStack_1930;
  undefined8 local_1928;
  allocator<char> local_191a;
  allocator<char> local_1919 [30];
  allocator<char> local_18fb;
  allocator<char> local_18fa;
  allocator<char> local_18f9 [28];
  allocator<char> local_18dd [2];
  allocator<char> local_18db;
  undefined1 local_18da;
  allocator<char> local_18d9 [28];
  allocator<char> local_18bd;
  undefined4 local_18bc;
  allocator<char> local_18b7;
  allocator<char> local_18b6;
  allocator<char> local_18b5;
  allocator<char> local_18b4;
  allocator<char> local_18b3;
  allocator<char> local_18b2;
  allocator<char> local_18b1;
  undefined4 local_18b0;
  allocator<char> local_18a9 [31];
  allocator<char> local_188a;
  allocator<char> local_1889 [897];
  undefined1 local_1508 [272];
  undefined1 local_13f8 [224];
  undefined1 local_1318 [136];
  undefined1 local_1290 [192];
  undefined1 local_11d0 [464];
  undefined8 local_1000;
  undefined1 local_fb0 [96];
  allocator<RPCArg> local_f50 [544];
  allocator<RPCArg> local_d30 [40];
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined1 local_cf0;
  undefined1 local_cef;
  undefined1 local_ce8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 local_cb0;
  undefined1 local_ca8;
  undefined1 local_ca7;
  undefined1 local_ba8 [264];
  undefined1 local_aa0 [160];
  undefined1 local_a00;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined1 local_9c0;
  undefined1 local_9bf;
  undefined1 local_8c0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined1 local_880;
  undefined1 local_87f;
  undefined1 local_7b8;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined1 local_778;
  undefined1 local_777;
  undefined1 local_678 [1584];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  RPCArg::RPCArg(in_stack_ffffffffffffe158,in_stack_ffffffffffffe150);
  RPCArg::RPCArg(in_stack_ffffffffffffe158,in_stack_ffffffffffffe150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_18b0 = 0;
  UniValue::UniValue<int,_int,_true>
            ((UniValue *)in_stack_ffffffffffffe158,(int *)in_stack_ffffffffffffe150);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe128,in_stack_ffffffffffffe120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_7b8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe130);
  local_790 = 0;
  uStack_788 = 0;
  local_780 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe118);
  local_778 = 0;
  local_777 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe194,in_stack_ffffffffffffe190),
                 in_stack_ffffffffffffe188,in_stack_ffffffffffffe184,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                 in_stack_ffffffffffffe170,in_stack_ffffffffffffe168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_8c0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe130);
  local_898 = 0;
  uStack_890 = 0;
  local_888 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe118);
  local_880 = 0;
  local_87f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe194,in_stack_ffffffffffffe190),
                 in_stack_ffffffffffffe188,in_stack_ffffffffffffe184,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                 in_stack_ffffffffffffe170,in_stack_ffffffffffffe168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  BlockFilterTypeName_abi_cxx11_(in_stack_ffffffffffffe13f);
  UniValue::
  UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)in_stack_ffffffffffffe158,&in_stack_ffffffffffffe150->m_names);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe128,in_stack_ffffffffffffe120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_a00 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe130);
  local_9d8 = 0;
  uStack_9d0 = 0;
  local_9c8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe118);
  local_9c0 = 0;
  local_9bf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe194,in_stack_ffffffffffffe190),
                 in_stack_ffffffffffffe188,in_stack_ffffffffffffe184,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                 in_stack_ffffffffffffe170,in_stack_ffffffffffffe168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_18bc = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe128,&in_stack_ffffffffffffe120->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_18da = 0;
  UniValue::UniValue<bool,_bool,_true>
            ((UniValue *)in_stack_ffffffffffffe158,(bool *)in_stack_ffffffffffffe150);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe128,in_stack_ffffffffffffe120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_ce8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe130);
  local_cc0 = 0;
  uStack_cb8 = 0;
  local_cb0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe118);
  local_ca8 = 0;
  local_ca7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe194,in_stack_ffffffffffffe190),
                 in_stack_ffffffffffffe188,in_stack_ffffffffffffe184,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                 in_stack_ffffffffffffe170,in_stack_ffffffffffffe168);
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe118);
  __l._M_len = (size_type)in_stack_ffffffffffffe168;
  __l._M_array = in_stack_ffffffffffffe160;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe158,__l,
             (allocator_type *)in_stack_ffffffffffffe150);
  local_d30[0] = (allocator<RPCArg>)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_d08 = 0;
  uStack_d00 = 0;
  local_cf8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe118);
  local_cf0 = 0;
  local_cef = 0;
  this = local_d30;
  RPCArg::RPCArg(in_stack_ffffffffffffe1a0,
                 (string *)CONCAT44(in_stack_ffffffffffffe19c,in_stack_ffffffffffffe198),
                 in_stack_ffffffffffffe194,(Fallback *)in_stack_ffffffffffffe188,
                 (string *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                 in_stack_ffffffffffffe1c0);
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len = (size_type)in_stack_ffffffffffffe168;
  __l_00._M_array = in_stack_ffffffffffffe160;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe158,__l_00,
             (allocator_type *)in_stack_ffffffffffffe150);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe158,(RPCResult *)in_stack_ffffffffffffe150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_1938 = 0;
  uStack_1930 = 0;
  local_1928 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe19c,
             (string *)CONCAT44(in_stack_ffffffffffffe194,in_stack_ffffffffffffe190),
             in_stack_ffffffffffffe188,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             (bool)in_stack_ffffffffffffe17f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_1958 = (pointer)0x0;
  pbStack_1950 = (pointer)0x0;
  local_1948._0_1_ = false;
  local_1948._1_1_ = false;
  local_1948._2_6_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe19c,
             (string *)CONCAT44(in_stack_ffffffffffffe194,in_stack_ffffffffffffe190),
             in_stack_ffffffffffffe188,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             (bool)in_stack_ffffffffffffe17f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_1998._M_allocated_capacity = 0;
  local_1998._8_8_ = 0;
  local_1988._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe19c,
             (string *)CONCAT44(in_stack_ffffffffffffe194,in_stack_ffffffffffffe190),
             in_stack_ffffffffffffe188,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             (bool)in_stack_ffffffffffffe17f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this);
  __l_01._M_len = (size_type)in_stack_ffffffffffffe168;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe160;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe158,__l_01,
             (allocator_type *)in_stack_ffffffffffffe150);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe19c,
             (string *)CONCAT44(in_stack_ffffffffffffe194,in_stack_ffffffffffffe190),
             in_stack_ffffffffffffe188,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             (bool)in_stack_ffffffffffffe17f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_19b8._M_unused._M_object = (void *)0x0;
  local_19b8._8_8_ = 0;
  local_19a8._M_p = (pointer)0x0;
  fun = &local_19b8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe19c,
             (string *)CONCAT44(in_stack_ffffffffffffe194,in_stack_ffffffffffffe190),
             in_stack_ffffffffffffe188,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             (bool)in_stack_ffffffffffffe17f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this);
  __l_02._M_len = (size_type)in_stack_ffffffffffffe168;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe160;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe158,__l_02,
             (allocator_type *)in_stack_ffffffffffffe150);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe1a0,
             (string *)CONCAT44(in_stack_ffffffffffffe19c,in_stack_ffffffffffffe198),
             in_stack_ffffffffffffe194,in_stack_ffffffffffffe188,
             (string *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_19f9[1] = (allocator<char>)0x0;
  local_19f9[2] = (allocator<char>)0x0;
  local_19f9[3] = (allocator<char>)0x0;
  local_19f9[4] = (allocator<char>)0x0;
  local_19f9[5] = (allocator<char>)0x0;
  local_19f9[6] = (allocator<char>)0x0;
  local_19f9[7] = (allocator<char>)0x0;
  local_19f9[8] = (allocator<char>)0x0;
  local_19f9[9] = (allocator<char>)0x0;
  local_19f9[10] = (allocator<char>)0x0;
  local_19f9[0xb] = (allocator<char>)0x0;
  local_19f9[0xc] = (allocator<char>)0x0;
  local_19f9[0xd] = (allocator<char>)0x0;
  local_19f9[0xe] = (allocator<char>)0x0;
  local_19f9[0xf] = (allocator<char>)0x0;
  local_19f9[0x10] = (allocator<char>)0x0;
  local_19f9[0x11] = (allocator<char>)0x0;
  local_19f9[0x12] = (allocator<char>)0x0;
  local_19f9[0x13] = (allocator<char>)0x0;
  local_19f9[0x14] = (allocator<char>)0x0;
  local_19f9[0x15] = (allocator<char>)0x0;
  local_19f9[0x16] = (allocator<char>)0x0;
  local_19f9[0x17] = (allocator<char>)0x0;
  local_19f9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe19c,
             (string *)CONCAT44(in_stack_ffffffffffffe194,in_stack_ffffffffffffe190),
             in_stack_ffffffffffffe188,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             (bool)in_stack_ffffffffffffe17f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  local_1a18 = (pointer)0x0;
  pRStack_1a10 = (pointer)0x0;
  local_1a08._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe1a0,in_stack_ffffffffffffe19c,
             (string *)CONCAT44(in_stack_ffffffffffffe194,in_stack_ffffffffffffe190),
             in_stack_ffffffffffffe188,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             (bool)in_stack_ffffffffffffe17f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this);
  __l_03._M_len = (size_type)in_stack_ffffffffffffe168;
  __l_03._M_array = (iterator)in_stack_ffffffffffffe160;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe158,__l_03,
             (allocator_type *)in_stack_ffffffffffffe150);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe1a0,
             (string *)CONCAT44(in_stack_ffffffffffffe19c,in_stack_ffffffffffffe198),
             in_stack_ffffffffffffe194,in_stack_ffffffffffffe188,
             (string *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178));
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe158,(RPCResult *)in_stack_ffffffffffffe150);
  results._M_len = (size_type)in_stack_ffffffffffffe168;
  results._M_array = (iterator)in_stack_ffffffffffffe160;
  RPCResults::RPCResults(in_stack_ffffffffffffe140,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  HelpExampleCli(&in_stack_ffffffffffffe150->m_names,in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  HelpExampleCli(&in_stack_ffffffffffffe150->m_names,in_stack_ffffffffffffe148);
  std::operator+(&in_stack_ffffffffffffe150->m_names,in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  HelpExampleCli(&in_stack_ffffffffffffe150->m_names,in_stack_ffffffffffffe148);
  std::operator+(&in_stack_ffffffffffffe150->m_names,in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  HelpExampleRpc(&in_stack_ffffffffffffe150->m_names,in_stack_ffffffffffffe148);
  std::operator+(&in_stack_ffffffffffffe150->m_names,in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  HelpExampleRpc(&in_stack_ffffffffffffe150->m_names,in_stack_ffffffffffffe148);
  std::operator+(&in_stack_ffffffffffffe150->m_names,in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe168,(char *)in_stack_ffffffffffffe160,
             (allocator<char> *)in_stack_ffffffffffffe158);
  HelpExampleRpc(&in_stack_ffffffffffffe150->m_names,in_stack_ffffffffffffe148);
  std::operator+(&in_stack_ffffffffffffe150->m_names,in_stack_ffffffffffffe148);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x567b57);
  this_00 = (RPCArg *)local_1a48;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::function<scanblocks()::__0,void>
            (in_stack_ffffffffffffe128,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe120);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffe288,in_stack_ffffffffffffe280,in_stack_ffffffffffffe278,
             in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,in_stack_ffffffffffffe260,
             (RPCMethodImpl *)fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1a48 + 0x23));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a24);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a23);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a22);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a21);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a20);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a1f);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a1e);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a1d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a1c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a1b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1a1a);
  RPCResults::~RPCResults((RPCResults *)this_00);
  local_1d58 = local_d30;
  do {
    local_1d58 = local_1d58 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1d58 != local_f50);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe128);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar2 = local_1508;
  local_1d70 = local_13f8;
  do {
    local_1d70 = local_1d70 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1d70 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe128);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1a08 + 0xe));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_19f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe128);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_19da);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_19d9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_19bc);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_19bb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_19ba);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe128);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar2 = local_11d0;
  puVar1 = local_fb0;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (puVar1 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe128);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_199b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_199a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe128);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar2 = local_1290;
  do {
    puVar2 = puVar2 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (puVar2 != local_1318);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe128);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1988 + 0xe));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1979);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_195a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1959);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe128);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_193a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1939);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe128);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_191a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1919);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_18fb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_18fa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_18f9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe128);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1db8 = local_48;
  do {
    local_1db8 = local_1db8 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1db8 != local_678);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::allocator<char>::~allocator(local_18dd);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe128);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1dd0 = local_aa0;
  do {
    local_1dd0 = local_1dd0 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1dd0 != local_ba8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_18db);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_18d9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_18bd);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_18b7);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_18b6);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_18b5);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_18b4);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_18b3);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_18b2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_18b1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_18a9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_188a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1889);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan scanblocks()
{
    return RPCHelpMan{"scanblocks",
        "\nReturn relevant blockhashes for given descriptors (requires blockfilterindex).\n"
        "This call may take several minutes. Make sure to use no RPC timeout (bitcoin-cli -rpcclienttimeout=0)",
        {
            scan_action_arg_desc,
            scan_objects_arg_desc,
            RPCArg{"start_height", RPCArg::Type::NUM, RPCArg::Default{0}, "Height to start to scan from"},
            RPCArg{"stop_height", RPCArg::Type::NUM, RPCArg::DefaultHint{"chain tip"}, "Height to stop to scan"},
            RPCArg{"filtertype", RPCArg::Type::STR, RPCArg::Default{BlockFilterTypeName(BlockFilterType::BASIC)}, "The type name of the filter"},
            RPCArg{"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "",
                {
                    {"filter_false_positives", RPCArg::Type::BOOL, RPCArg::Default{false}, "Filter false positives (slower and may fail on pruned nodes). Otherwise they may occur at a rate of 1/M"},
                },
                RPCArgOptions{.oneline_description="options"}},
        },
        {
            scan_result_status_none,
            RPCResult{"When action=='start'; only returns after scan completes", RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::NUM, "from_height", "The height we started the scan from"},
                {RPCResult::Type::NUM, "to_height", "The height we ended the scan at"},
                {RPCResult::Type::ARR, "relevant_blocks", "Blocks that may have matched a scanobject.", {
                    {RPCResult::Type::STR_HEX, "blockhash", "A relevant blockhash"},
                }},
                {RPCResult::Type::BOOL, "completed", "true if the scan process was not aborted"}
            }},
            RPCResult{"when action=='status' and a scan is currently in progress", RPCResult::Type::OBJ, "", "", {
                    {RPCResult::Type::NUM, "progress", "Approximate percent complete"},
                    {RPCResult::Type::NUM, "current_height", "Height of the block currently being scanned"},
                },
            },
            scan_result_abort,
        },
        RPCExamples{
            HelpExampleCli("scanblocks", "start '[\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"]' 300000") +
            HelpExampleCli("scanblocks", "start '[\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"]' 100 150 basic") +
            HelpExampleCli("scanblocks", "status") +
            HelpExampleRpc("scanblocks", "\"start\", [\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"], 300000") +
            HelpExampleRpc("scanblocks", "\"start\", [\"addr(bcrt1q4u4nsgk6ug0sqz7r3rj9tykjxrsl0yy4d0wwte)\"], 100, 150, \"basic\"") +
            HelpExampleRpc("scanblocks", "\"status\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue ret(UniValue::VOBJ);
    if (request.params[0].get_str() == "status") {
        BlockFiltersScanReserver reserver;
        if (reserver.reserve()) {
            // no scan in progress
            return NullUniValue;
        }
        ret.pushKV("progress", g_scanfilter_progress.load());
        ret.pushKV("current_height", g_scanfilter_progress_height.load());
        return ret;
    } else if (request.params[0].get_str() == "abort") {
        BlockFiltersScanReserver reserver;
        if (reserver.reserve()) {
            // reserve was possible which means no scan was running
            return false;
        }
        // set the abort flag
        g_scanfilter_should_abort_scan = true;
        return true;
    } else if (request.params[0].get_str() == "start") {
        BlockFiltersScanReserver reserver;
        if (!reserver.reserve()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Scan already in progress, use action \"abort\" or \"status\"");
        }
        const std::string filtertype_name{request.params[4].isNull() ? "basic" : request.params[4].get_str()};

        BlockFilterType filtertype;
        if (!BlockFilterTypeByName(filtertype_name, filtertype)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Unknown filtertype");
        }

        UniValue options{request.params[5].isNull() ? UniValue::VOBJ : request.params[5]};
        bool filter_false_positives{options.exists("filter_false_positives") ? options["filter_false_positives"].get_bool() : false};

        BlockFilterIndex* index = GetBlockFilterIndex(filtertype);
        if (!index) {
            throw JSONRPCError(RPC_MISC_ERROR, "Index is not enabled for filtertype " + filtertype_name);
        }

        NodeContext& node = EnsureAnyNodeContext(request.context);
        ChainstateManager& chainman = EnsureChainman(node);

        // set the start-height
        const CBlockIndex* start_index = nullptr;
        const CBlockIndex* stop_block = nullptr;
        {
            LOCK(cs_main);
            CChain& active_chain = chainman.ActiveChain();
            start_index = active_chain.Genesis();
            stop_block = active_chain.Tip(); // If no stop block is provided, stop at the chain tip.
            if (!request.params[2].isNull()) {
                start_index = active_chain[request.params[2].getInt<int>()];
                if (!start_index) {
                    throw JSONRPCError(RPC_MISC_ERROR, "Invalid start_height");
                }
            }
            if (!request.params[3].isNull()) {
                stop_block = active_chain[request.params[3].getInt<int>()];
                if (!stop_block || stop_block->nHeight < start_index->nHeight) {
                    throw JSONRPCError(RPC_MISC_ERROR, "Invalid stop_height");
                }
            }
        }
        CHECK_NONFATAL(start_index);
        CHECK_NONFATAL(stop_block);

        // loop through the scan objects, add scripts to the needle_set
        GCSFilter::ElementSet needle_set;
        for (const UniValue& scanobject : request.params[1].get_array().getValues()) {
            FlatSigningProvider provider;
            std::vector<CScript> scripts = EvalDescriptorStringOrObject(scanobject, provider);
            for (const CScript& script : scripts) {
                needle_set.emplace(script.begin(), script.end());
            }
        }
        UniValue blocks(UniValue::VARR);
        const int amount_per_chunk = 10000;
        std::vector<BlockFilter> filters;
        int start_block_height = start_index->nHeight; // for progress reporting
        const int total_blocks_to_process = stop_block->nHeight - start_block_height;

        g_scanfilter_should_abort_scan = false;
        g_scanfilter_progress = 0;
        g_scanfilter_progress_height = start_block_height;
        bool completed = true;

        const CBlockIndex* end_range = nullptr;
        do {
            node.rpc_interruption_point(); // allow a clean shutdown
            if (g_scanfilter_should_abort_scan) {
                completed = false;
                break;
            }

            // split the lookup range in chunks if we are deeper than 'amount_per_chunk' blocks from the stopping block
            int start_block = !end_range ? start_index->nHeight : start_index->nHeight + 1; // to not include the previous round 'end_range' block
            end_range = (start_block + amount_per_chunk < stop_block->nHeight) ?
                    WITH_LOCK(::cs_main, return chainman.ActiveChain()[start_block + amount_per_chunk]) :
                    stop_block;

            if (index->LookupFilterRange(start_block, end_range, filters)) {
                for (const BlockFilter& filter : filters) {
                    // compare the elements-set with each filter
                    if (filter.GetFilter().MatchAny(needle_set)) {
                        if (filter_false_positives) {
                            // Double check the filter matches by scanning the block
                            const CBlockIndex& blockindex = *CHECK_NONFATAL(WITH_LOCK(cs_main, return chainman.m_blockman.LookupBlockIndex(filter.GetBlockHash())));

                            if (!CheckBlockFilterMatches(chainman.m_blockman, blockindex, needle_set)) {
                                continue;
                            }
                        }

                        blocks.push_back(filter.GetBlockHash().GetHex());
                    }
                }
            }
            start_index = end_range;

            // update progress
            int blocks_processed = end_range->nHeight - start_block_height;
            if (total_blocks_to_process > 0) { // avoid division by zero
                g_scanfilter_progress = (int)(100.0 / total_blocks_to_process * blocks_processed);
            } else {
                g_scanfilter_progress = 100;
            }
            g_scanfilter_progress_height = end_range->nHeight;

        // Finish if we reached the stop block
        } while (start_index != stop_block);

        ret.pushKV("from_height", start_block_height);
        ret.pushKV("to_height", start_index->nHeight); // start_index is always the last scanned block here
        ret.pushKV("relevant_blocks", std::move(blocks));
        ret.pushKV("completed", completed);
    }
    else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid action '%s'", request.params[0].get_str()));
    }
    return ret;
},
    };
}